

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DRunningScript::Serialize(DRunningScript *this,FArchive *arc)

{
  FArchive *pFVar1;
  long lVar2;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = FArchive::SerializeObject
                     (arc,(DObject **)&this->script,DFsScript::RegistrationInfo.MyClass);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->save_point);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->wait_type);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->wait_data);
  pFVar1 = FArchive::SerializeObject(pFVar1,(DObject **)&this->prev,RegistrationInfo.MyClass);
  pFVar1 = FArchive::SerializeObject(pFVar1,(DObject **)&this->next,RegistrationInfo.MyClass);
  FArchive::SerializeObject(pFVar1,(DObject **)&this->trigger,AActor::RegistrationInfo.MyClass);
  lVar2 = 0;
  do {
    FArchive::SerializeObject
              (arc,(DObject **)((long)&this->variables[0].field_0 + lVar2),
               DFsVariable::RegistrationInfo.MyClass);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void DRunningScript::Serialize(FArchive &arc)
{
	Super::Serialize(arc);

	arc << script << save_point << wait_type << wait_data << prev << next << trigger;
	for(int i=0; i< VARIABLESLOTS; i++) arc << variables[i];
}